

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

bool __thiscall ghc::net::uri::empty(uri *this)

{
  bool bVar1;
  uint uVar2;
  byte local_3a;
  string local_38;
  uri *local_18;
  uri *this_local;
  
  local_18 = this;
  uVar2 = std::__cxx11::string::empty();
  bVar1 = false;
  local_3a = 0;
  if ((uVar2 & 1) != 0) {
    authority_abi_cxx11_(&local_38,this);
    bVar1 = true;
    uVar2 = std::__cxx11::string::empty();
    local_3a = 0;
    if ((uVar2 & 1) != 0) {
      uVar2 = std::__cxx11::string::empty();
      local_3a = 0;
      if ((uVar2 & 1) != 0) {
        uVar2 = std::__cxx11::string::empty();
        local_3a = 0;
        if ((uVar2 & 1) != 0) {
          local_3a = std::__cxx11::string::empty();
        }
      }
    }
  }
  this_local._7_1_ = local_3a & 1;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

GHC_INLINE bool uri::empty() const
{
    return _scheme.empty() && authority().empty() && _path.empty() && _query.empty() && _fragment.empty();
}